

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void * __thiscall
Lib::
SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
::insertPositionRaw<Inferences::ALASCA::SuperpositionConf::Rhs>
          (SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
           *this,Rhs *key)

{
  uint uVar1;
  uint uVar2;
  Node *pNVar3;
  result_type_conflict1 rVar4;
  Node *pNVar5;
  uint uVar6;
  Node *pNVar7;
  uint uVar8;
  ulong uVar9;
  param_type local_38;
  
  uVar8 = 0xffffffff;
  do {
    local_38._M_a = 0;
    local_38._M_b = 1;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_38,&Random::_eng,&local_38);
    uVar8 = uVar8 + 1;
  } while (rVar4 != 0);
  uVar6 = this->_top;
  if (uVar6 <= uVar8) {
    if (uVar6 < 0x20) {
      this->_top = uVar6 + 1;
      uVar8 = uVar6;
    }
    else {
      uVar8 = uVar6 - 1;
    }
  }
  uVar9 = (ulong)uVar8 * 8 + 0x5f & 0xffffffff0;
  if (uVar9 == 0) {
    pNVar5 = (Node *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x11) {
    pNVar5 = (Node *)FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar9 < 0x19) {
    pNVar5 = (Node *)FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar9 < 0x21) {
    pNVar5 = (Node *)FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar9 < 0x31) {
    pNVar5 = (Node *)FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar9 < 0x41) {
    pNVar5 = (Node *)FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pNVar5 = (Node *)::operator_new(uVar9,0x10);
  }
  uVar9 = (ulong)this->_top;
  pNVar7 = this->_left;
LAB_00384a22:
  do {
    uVar6 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar6;
    pNVar3 = pNVar7;
    do {
      pNVar7 = pNVar3;
      pNVar3 = pNVar7->nodes[uVar9];
      if (pNVar3 == (Node *)0x0) {
        if (uVar8 < uVar6) goto LAB_00384a22;
        pNVar7->nodes[uVar9] = pNVar5;
        pNVar5->nodes[uVar9] = (Node *)0x0;
        goto LAB_00384a70;
      }
      uVar1 = (((key->super_SelectedLiteral).cl)->super_Unit)._number;
      uVar2 = (((pNVar3->value).super_SelectedLiteral.cl)->super_Unit)._number;
    } while ((uVar2 <= uVar1) &&
            ((uVar2 < uVar1 ||
             ((pNVar3->value).super_SelectedLiteral.litIdx <= (key->super_SelectedLiteral).litIdx)))
            );
    if (uVar6 <= uVar8) {
      pNVar5->nodes[uVar9] = pNVar3;
      pNVar7->nodes[uVar9] = pNVar5;
LAB_00384a70:
      if (uVar9 == 0) {
        return pNVar5;
      }
    }
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }